

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int wait_until_stream_ready(cubeb_stream_conflict *stm)

{
  int iVar1;
  pa_threaded_mainloop *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(long *)(in_RDI + 0x10) != 0) &&
     (iVar1 = wait_until_io_stream_ready
                        ((pa_stream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI), iVar1 == -1)) {
    return -1;
  }
  if ((*(long *)(in_RDI + 0x18) != 0) &&
     (iVar1 = wait_until_io_stream_ready
                        ((pa_stream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI), iVar1 == -1)) {
    return -1;
  }
  return 0;
}

Assistant:

static int
wait_until_stream_ready(cubeb_stream * stm)
{
  if (stm->output_stream &&
      wait_until_io_stream_ready(stm->output_stream, stm->context->mainloop) ==
          -1) {
    return -1;
  }
  if (stm->input_stream &&
      wait_until_io_stream_ready(stm->input_stream, stm->context->mainloop) ==
          -1) {
    return -1;
  }
  return 0;
}